

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  cmExecutionStatus *pcVar3;
  cmFileCopier *this_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Status SVar7;
  size_t sVar8;
  unsigned_long uVar9;
  char *pcVar10;
  ostream *poVar11;
  mode_t permissions_00;
  unsigned_long dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  Directory dir;
  mode_t permissions;
  string fromPath;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  string toPath;
  ostringstream e;
  cmFileCopier *local_258;
  Directory local_250;
  mode_t local_248;
  uint local_244;
  char *local_240;
  char *pcStack_238;
  char local_230;
  undefined7 uStack_22f;
  string *local_210;
  unsigned_long local_208;
  string *local_200;
  string local_1f8;
  mode_t *local_1d8;
  mode_t local_1cc;
  string local_1c8;
  undefined1 local_1a8 [16];
  char *local_198;
  char *pcStack_190;
  size_t local_188;
  char *local_180;
  ios_base local_138 [264];
  
  local_258 = this;
  bVar4 = cmsys::SystemTools::FileIsDirectory(destination);
  bVar5 = true;
  if (bVar4) {
    bVar5 = cmsys::SystemTools::FileIsSymlink(destination);
  }
  this_00 = local_258;
  (*local_258->_vptr_cmFileCopier[5])(local_258,destination,1,(ulong)bVar5);
  local_1d8 = &local_1cc;
  local_1cc = 0;
  bVar4 = GetDefaultDirectoryPermissions(this_00,&local_1d8);
  if (bVar4) {
    SVar7 = cmsys::SystemTools::MakeDirectory(destination,local_1d8);
    if (SVar7.Kind_ == Success) {
      local_248 = match_properties.Permissions;
      if ((ulong)match_properties >> 0x20 == 0) {
        local_248 = local_258->DirPermissions;
      }
      if (local_248 == 0) {
        cmsys::SystemTools::GetPermissions(source,&local_248);
      }
      permissions_00 = local_248 | 0x1c0;
      local_244 = local_248;
      if ((~local_248 & 0x1c0) == 0) {
        local_244 = 0;
        permissions_00 = local_248;
      }
      bVar4 = SetPermissions(local_258,destination,permissions_00);
      if (bVar4) {
        cmsys::Directory::Directory(&local_250);
        if (source->_M_string_length != 0) {
          cmsys::Directory::Load(&local_250,source,(string *)0x0);
        }
        uVar9 = cmsys::Directory::GetNumberOfFiles(&local_250);
        if (uVar9 != 0) {
          dindex = 0;
          local_210 = destination;
          local_208 = uVar9;
          local_200 = source;
          do {
            pcVar10 = cmsys::Directory::GetFile(&local_250,dindex);
            iVar6 = strcmp(pcVar10,".");
            if (iVar6 != 0) {
              pcVar10 = cmsys::Directory::GetFile(&local_250,dindex);
              iVar6 = strcmp(pcVar10,"..");
              if (iVar6 != 0) {
                pcVar1 = (source->_M_dataplus)._M_p;
                pp_Var2 = (_func_int **)source->_M_string_length;
                local_240 = (char *)0x1;
                pcStack_238 = &local_230;
                local_230 = '/';
                pcVar10 = cmsys::Directory::GetFile(&local_250,dindex);
                local_198 = local_240;
                pcStack_190 = pcStack_238;
                local_1a8._0_8_ = pp_Var2;
                local_1a8._8_8_ = pcVar1;
                local_188 = strlen(pcVar10);
                views._M_len = 3;
                views._M_array = (iterator)local_1a8;
                local_180 = pcVar10;
                cmCatViews_abi_cxx11_(&local_1f8,views);
                pcVar1 = (local_210->_M_dataplus)._M_p;
                pp_Var2 = (_func_int **)local_210->_M_string_length;
                local_240 = &DAT_00000001;
                pcStack_238 = &local_230;
                local_230 = '/';
                pcVar10 = cmsys::Directory::GetFile(&local_250,dindex);
                local_198 = local_240;
                pcStack_190 = pcStack_238;
                local_1a8._0_8_ = pp_Var2;
                local_1a8._8_8_ = pcVar1;
                local_188 = strlen(pcVar10);
                views_00._M_len = 3;
                views_00._M_array = (iterator)local_1a8;
                local_180 = pcVar10;
                cmCatViews_abi_cxx11_(&local_1c8,views_00);
                iVar6 = (*local_258->_vptr_cmFileCopier[3])(local_258,&local_1f8,&local_1c8);
                uVar9 = local_208;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                destination = local_210;
                source = local_200;
                if ((char)iVar6 == '\0') {
                  bVar4 = false;
                  goto LAB_004944a8;
                }
              }
            }
            dindex = dindex + 1;
          } while (uVar9 != dindex);
        }
        bVar4 = SetPermissions(local_258,destination,local_244);
LAB_004944a8:
        cmsys::Directory::~Directory(&local_250);
        return bVar4;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pcVar10 = local_258->Name;
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)(_func_int *)
                             ((long)&local_258 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) +
                        0xb0);
      }
      else {
        sVar8 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," cannot make directory \"",0x18);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(destination->_M_dataplus)._M_p,
                           destination->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\": ",3);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_240,(long)pcStack_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
      if (local_240 != &local_230) {
        operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
      pcVar3 = local_258->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar3->Error);
      if (local_240 != &local_230) {
        operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return false;
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !( // Report "Up-to-date:" for existing directories,
                      // but not symlinks to them.
                     cmSystemTools::FileIsDirectory(destination) &&
                     !cmSystemTools::FileIsSymlink(destination)));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << cmSystemTools::GetLastSystemError() << ".";
    this->Status.SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = cmStrCat(source, '/', dir.GetFile(fileNum));
      std::string toPath = cmStrCat(destination, '/', dir.GetFile(fileNum));
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}